

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extralev.c
# Opt level: O3

void miniwalk(int x,int y)

{
  byte *pbVar1;
  uint uVar2;
  uchar *puVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int dirs [4];
  undefined4 local_48 [6];
  
  uVar6 = (ulong)(uint)y;
  do {
    lVar9 = (long)x;
    iVar5 = (int)uVar6;
    if (x < 1) {
      uVar8 = 0;
LAB_0019d822:
      uVar7 = uVar8;
      if (((*(byte *)(lVar9 * 0x24 + 0x328d15 + (long)iVar5 * 0xc) & 8) == 0) &&
         ((*(char *)((long)(int)(x + 1) * 0x24 + 0x328d15 + (long)iVar5 * 0xc) == '\0' ||
          (uVar2 = mt_random(),
          (uVar2 * -0x33333333 >> 1 | (uint)((uVar2 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a))
         )) {
        uVar7 = (ulong)((int)uVar8 + 1);
        local_48[uVar8] = 1;
      }
    }
    else {
      uVar7 = 0;
      if (((*(byte *)((ulong)(uint)x * 0x24 + 0x328d15 + (long)iVar5 * 0xc) & 4) == 0) &&
         ((*(char *)((ulong)(x - 1) * 0x24 + 0x328d15 + (long)iVar5 * 0xc) == '\0' ||
          (uVar2 = mt_random(),
          (uVar2 * -0x33333333 >> 1 | (uint)((uVar2 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a))
         )) {
        local_48[0] = 0;
        uVar7 = 1;
      }
      uVar8 = uVar7;
      if (x == 1) goto LAB_0019d822;
    }
    uVar8 = uVar7;
    if (iVar5 < 1) {
LAB_0019d8bd:
      uVar7 = uVar8;
      if (((*(byte *)(lVar9 * 0x24 + 0x328d15 + (long)iVar5 * 0xc) & 2) != 0) ||
         ((*(char *)(lVar9 * 0x24 + 0x328d15 + (long)(iVar5 + 1) * 0xc) != '\0' &&
          (uVar2 = mt_random(),
          0x19999999 < (uVar2 * -0x33333333 >> 1 | (uint)((uVar2 * -0x33333333 & 1) != 0) << 0x1f)))
         )) goto LAB_0019d8f4;
      uVar7 = (ulong)((int)uVar8 + 1);
      local_48[uVar8] = 3;
    }
    else {
      if (((*(byte *)(lVar9 * 0x24 + 0x328d15 + uVar6 * 0xc) & 1) == 0) &&
         ((*(char *)(lVar9 * 0x24 + 0x328d15 + (ulong)(iVar5 - 1) * 0xc) == '\0' ||
          (uVar2 = mt_random(),
          (uVar2 * -0x33333333 >> 1 | (uint)((uVar2 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a))
         )) {
        uVar8 = (ulong)((int)uVar7 + 1);
        local_48[uVar7] = 2;
      }
      uVar7 = uVar8;
      if (iVar5 == 1) goto LAB_0019d8bd;
LAB_0019d8f4:
      if ((int)uVar7 == 0) {
        return;
      }
    }
    uVar2 = mt_random();
    switch(local_48[(ulong)uVar2 % uVar7]) {
    case 0:
      pbVar1 = (byte *)(lVar9 * 0x24 + 0x328d15 + (long)iVar5 * 0xc);
      *pbVar1 = *pbVar1 | 4;
      x = x - 1;
      puVar3 = &r[x][iVar5].doortable;
      bVar4 = 8;
      break;
    case 1:
      pbVar1 = (byte *)(lVar9 * 0x24 + 0x328d15 + (long)iVar5 * 0xc);
      *pbVar1 = *pbVar1 | 8;
      x = x + 1;
      puVar3 = &r[x][iVar5].doortable;
      bVar4 = 4;
      break;
    case 2:
      pbVar1 = (byte *)(lVar9 * 0x24 + 0x328d15 + (long)iVar5 * 0xc);
      *pbVar1 = *pbVar1 | 1;
      uVar6 = (ulong)(iVar5 - 1U);
      puVar3 = &r[lVar9][(int)(iVar5 - 1U)].doortable;
      bVar4 = 2;
      break;
    case 3:
      pbVar1 = (byte *)(lVar9 * 0x24 + 0x328d15 + (long)iVar5 * 0xc);
      *pbVar1 = *pbVar1 | 2;
      uVar6 = (ulong)(iVar5 + 1U);
      puVar3 = &r[lVar9][(int)(iVar5 + 1U)].doortable;
      bVar4 = 1;
      break;
    default:
      goto switchD_0019d92c_default;
    }
    *puVar3 = *puVar3 | bVar4;
switchD_0019d92c_default:
    miniwalk(x,(int)uVar6);
  } while( true );
}

Assistant:

static void miniwalk(int x, int y)
{
	int q, dir;
	int dirs[4];

	while (1) {
		q = 0;
#define doorhere (r[x][y].doortable)
		if (x>0 && (!(doorhere & LEFT)) &&
					(!r[x-1][y].doortable || !rn2(10)))
			dirs[q++] = 0;
		if (x<2 && (!(doorhere & RIGHT)) &&
					(!r[x+1][y].doortable || !rn2(10)))
			dirs[q++] = 1;
		if (y>0 && (!(doorhere & UP)) &&
					(!r[x][y-1].doortable || !rn2(10)))
			dirs[q++] = 2;
		if (y<2 && (!(doorhere & DOWN)) &&
					(!r[x][y+1].doortable || !rn2(10)))
			dirs[q++] = 3;
	/* Rogue levels aren't just 3 by 3 mazes; they have some extra
	 * connections, thus that 1/10 chance
	 */
		if (!q) return;
		dir = dirs[rn2(q)];
		switch(dir) { /* Move in direction */
			case 0: doorhere |= LEFT;
				x--;
				doorhere |= RIGHT;
				break;
			case 1: doorhere |= RIGHT;
				x++;
				doorhere |= LEFT;
				break;
			case 2: doorhere |= UP;
				y--;
				doorhere |= DOWN;
				break;
			case 3: doorhere |= DOWN;
				y++;
				doorhere |= UP;
				break;
		}
		miniwalk(x,y);
	}
}